

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void shopper_financial_report(void)

{
  level *lev;
  char rmno;
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_2c;
  int pass;
  long amt;
  eshk *eshkp;
  monst *this_shkp;
  monst *shkp;
  
  lev = level;
  rmno = inside_shop(level,u.ux,u.uy);
  eshkp = (eshk *)shop_keeper(lev,rmno);
  if (((eshkp != (eshk *)0x0) && (*(int *)&eshkp[1].bill[1].useup == 0)) &&
     (lVar1 = shop_debt((eshk *)&eshkp->bill[7].useup), lVar1 == 0)) {
    pline("You have no credit or debt in here.");
    eshkp = (eshk *)0x0;
  }
  for (local_2c = (uint)(eshkp == (eshk *)0x0); (int)local_2c < 2; local_2c = local_2c + 1) {
    for (this_shkp = next_shkp(level->monlist,'\0'); this_shkp != (monst *)0x0;
        this_shkp = next_shkp(this_shkp->nmon,'\0')) {
      if (((eshk *)this_shkp != eshkp) == local_2c) {
        lVar1 = (long)(int)this_shkp[0x1b].mappearance;
        if (lVar1 == 0) {
          if ((eshk *)this_shkp == eshkp) {
            pline("You have no credit in here.");
          }
        }
        else {
          pcVar2 = currency(lVar1);
          pcVar3 = shkname(this_shkp);
          pcVar3 = s_suffix(pcVar3);
          pline("You have %ld %s credit at %s %s.",lVar1,pcVar2,pcVar3,
                shtypes[(short)this_shkp[0x1b].misc_worn_check + -0x12].name);
        }
        lVar1 = shop_debt((eshk *)&this_shkp->field_0x74);
        if (lVar1 == 0) {
          if ((eshk *)this_shkp == eshkp) {
            pline("You don\'t owe any money here.");
          }
        }
        else {
          pcVar2 = shkname(this_shkp);
          pcVar3 = currency(lVar1);
          pline("You owe %s %ld %s.",pcVar2,lVar1,pcVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void shopper_financial_report(void)
{
	struct monst *shkp, *this_shkp = shop_keeper(level, inside_shop(level, u.ux, u.uy));
	struct eshk *eshkp;
	long amt;
	int pass;

	if (this_shkp &&
	    !(ESHK(this_shkp)->credit || shop_debt(ESHK(this_shkp)))) {
	    pline("You have no credit or debt in here.");
	    this_shkp = 0;	/* skip first pass */
	}

	/* pass 0: report for the shop we're currently in, if any;
	   pass 1: report for all other shops on this level. */
	for (pass = this_shkp ? 0 : 1; pass <= 1; pass++)
	    for (shkp = next_shkp(level->monlist, FALSE);
		    shkp; shkp = next_shkp(shkp->nmon, FALSE)) {
		if ((shkp != this_shkp) ^ pass) continue;
		eshkp = ESHK(shkp);
		if ((amt = eshkp->credit) != 0)
		    pline("You have %ld %s credit at %s %s.",
			amt, currency(amt), s_suffix(shkname(shkp)),
			shtypes[eshkp->shoptype - SHOPBASE].name);
		else if (shkp == this_shkp)
		    pline("You have no credit in here.");
		if ((amt = shop_debt(eshkp)) != 0)
		    pline("You owe %s %ld %s.",
			shkname(shkp), amt, currency(amt));
		else if (shkp == this_shkp)
		    pline("You don't owe any money here.");
	    }
}